

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O2

void avl_remove(avl_tree *tree,avl_node *node)

{
  avl_node *paVar1;
  uint uVar2;
  avl_node *paVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  avl_node *paVar6;
  ulong uVar7;
  uint uVar8;
  int bf;
  uint uVar9;
  avl_tree right_subtree;
  
  if (node != (avl_node *)0x0) {
    paVar5 = node->right;
    right_subtree.root = paVar5;
    paVar3 = avl_first(&right_subtree);
    if (paVar3 == (avl_node *)0x0) {
      paVar5 = (avl_node *)((ulong)node->parent & 0xfffffffffffffffc);
      if (paVar5 == (avl_node *)0x0) {
        paVar3 = node->left;
        bf = 0;
      }
      else {
        paVar3 = node->left;
        if (paVar5->left == node) {
          paVar5->left = paVar3;
          bf = 1;
        }
        else {
          paVar5->right = paVar3;
          bf = -1;
        }
      }
      if (paVar3 != (avl_node *)0x0) {
        paVar3->parent = (avl_node *)((ulong)((uint)paVar3->parent & 3) | (ulong)paVar5);
        paVar5 = (avl_node *)((ulong)node->parent & 0xfffffffffffffffc);
      }
    }
    else {
      paVar6 = (avl_node *)((ulong)paVar3->parent & 0xfffffffffffffffc);
      if (paVar6 != node && paVar6 != (avl_node *)0x0) {
        paVar1 = paVar3->right;
        paVar6->left = paVar1;
        if (paVar1 != (avl_node *)0x0) {
          paVar1->parent = (avl_node *)((ulong)((uint)paVar1->parent & 3) | (ulong)paVar6);
        }
      }
      uVar7 = (ulong)node->parent & 0xfffffffffffffffc;
      if (uVar7 != 0) {
        if (*(avl_node **)(uVar7 + 8) == node) {
          *(avl_node **)(uVar7 + 8) = paVar3;
        }
        else {
          *(avl_node **)(uVar7 + 0x10) = paVar3;
          paVar5 = node->right;
        }
      }
      if (paVar5 == paVar3) {
        bf = -1;
        paVar5 = paVar3;
      }
      else {
        paVar3->right = paVar5;
        paVar5 = node->right;
        if (paVar5 != (avl_node *)0x0) {
          paVar5->parent = (avl_node *)((ulong)((uint)paVar5->parent & 3) | (ulong)paVar3);
        }
        bf = 1;
        paVar5 = (avl_node *)((ulong)paVar3->parent & 0xfffffffffffffffc);
      }
      paVar6 = node->left;
      paVar3->left = paVar6;
      if (paVar6 != (avl_node *)0x0) {
        paVar6->parent = (avl_node *)((ulong)((uint)paVar6->parent & 3) | (ulong)paVar3);
      }
      uVar7 = (ulong)node->parent & 0xfffffffffffffffc;
      paVar3->parent = (avl_node *)((uint)paVar3->parent & 3 | uVar7);
      paVar3->parent = (avl_node *)((uint)node->parent & 3 | uVar7);
    }
    if (tree->root == node) {
      tree->root = paVar3;
    }
    do {
      if (paVar5 == (avl_node *)0x0) {
        return;
      }
      paVar3 = paVar5->parent;
      paVar6 = (avl_node *)((ulong)paVar3 & 0xfffffffffffffffc);
      if (paVar6 == (avl_node *)0x0) {
        if (paVar5 == tree->root) {
          paVar5 = _balance_tree(tree->root,bf);
          tree->root = paVar5;
          return;
        }
      }
      else {
        paVar1 = paVar6->right;
        paVar4 = _balance_tree(paVar5,bf);
        (&paVar6->left)[paVar1 == paVar5] = paVar4;
        if ((paVar4->left != (avl_node *)0x0) || (paVar4->right != (avl_node *)0x0)) {
          uVar9 = ((uint)paVar3 & 3) - 1;
          uVar2 = -uVar9;
          if (0 < (int)uVar9) {
            uVar2 = uVar9;
          }
          uVar8 = (*(uint *)&paVar4->parent & 3) - 1;
          uVar9 = -uVar8;
          if (0 < (int)uVar8) {
            uVar9 = uVar8;
          }
          if (uVar2 <= uVar9) {
            return;
          }
        }
        bf = (uint)(paVar6->left == paVar4) * 2 + -1;
      }
      paVar5 = paVar6;
    } while (bf != 0);
  }
  return;
}

Assistant:

void avl_remove(struct avl_tree *tree,
                struct avl_node *node)
{
    __AVL_DEBUG_REMOVE(node);

    // not found
    if (node == NULL) return;

    struct avl_tree right_subtree;
    struct avl_node *p=NULL,*cur, *next=NULL;
    int bf = 0, bf_old;


#ifdef _AVL_NEXT_POINTER
    if (node->prev) node->prev->next = node->next;
    if (node->next) node->next->prev = node->prev;
#endif

    // find smallest node in right sub-tree
    right_subtree.root = node->right;
    next = avl_first(&right_subtree);

    if (next) {
        // 1. NEXT exists
        if (avl_parent(next)) {
            if (avl_parent(next) != node) {
                // NODE is not NEXT's direct parent
                // MUST ensure NEXT should be *left child* of its parent
                // MUST ensure NEXT doesn't have right child
                avl_parent(next)->left = next->right;
                if (next->right)
                    avl_set_parent(next->right, avl_parent(next));
            }
        }
        if (avl_parent(node)) {
            // replace NODE by NEXT
            if (avl_parent(node)->left == node) {
                avl_parent(node)->left = next;
            } else {
                avl_parent(node)->right = next;
            }
        }

        // re-link pointers
        if (node->right != next) {
            next->right = node->right;
            if (node->right) avl_set_parent(node->right, next);
            cur = avl_parent(next);
            bf = 1;
        }else{
            cur = next;
            bf = -1;
        }

        next->left = node->left;
        if (node->left) avl_set_parent(node->left, next);
        avl_set_parent(next, avl_parent(node));

        // inherit NODE's balance factor
        avl_set_bf(next, avl_bf(node));

    } else {
        // 2. NEXT == NULL (only when there's no right sub-tree)
        p = avl_parent(node);
        if (p) {
            if (p->left == node) {
                p->left = node->left;
                bf = 1;
            } else {
                p->right = node->left;
                bf = -1;
            }
        }
        if (node->left)
            avl_set_parent(node->left, p);

        cur = avl_parent(node);
    }

    // reset root
    if (tree->root == node) {
        tree->root = next;
        if (next == NULL) {
            if (node->left) tree->root = node->left;
        }
    }

    // recursive balancing process .. scan from CUR to root
    while(cur) {
        p = avl_parent(cur);
        if (p) {
            // if parent exists
            bf_old = avl_bf(cur);

            if (p->right == cur) {
                cur = _balance_tree(cur, bf);
                p->right = cur;
            }else {
                cur = _balance_tree(cur, bf);
                p->left = cur;
            }

            // calculate balance facter BF for parent
            if (cur->left == NULL && cur->right == NULL) {
                // leaf node
                if (p->left == cur) bf = 1;
                else bf = -1;
            } else {
                // index ndoe
                bf = 0;
                if (_abs(bf_old) > _abs(avl_bf(cur))) {
                    // if ABS of balance factor decreases
                    // cascade to parent
                    if (p->left == cur) bf = 1;
                    else bf = -1;
                }
            }

        } else if(cur == tree->root){
            tree->root = _balance_tree(tree->root, bf);
            break;
        }
        if (bf == 0) break;

        cur = p;
    }

    __AVL_DEBUG_DISPLAY(tree);
}